

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::Sign(Psbt *this,Privkey *privkey,bool has_grind_r)

{
  CfdException *this_00;
  allocator local_5d;
  int ret;
  undefined1 local_58 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  
  Privkey::GetData((ByteData *)local_58,privkey);
  ByteData::GetBytes(&key,(ByteData *)local_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  ret = wally_psbt_sign(this->wally_psbt_pointer_,
                        key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(ulong)has_grind_r << 2);
  if (ret == 0) {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  local_58._0_8_ = "cfdcore_psbt.cpp";
  local_58._8_4_ = 0x85f;
  local_58._16_8_ = "Sign";
  logger::warn<int&>((CfdSourceLocation *)local_58,"wally_psbt_sign NG[{}]",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_58,"psbt sign error.",&local_5d);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::Sign(const Privkey &privkey, bool has_grind_r) {
  std::vector<uint8_t> key = privkey.GetData().GetBytes();
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  int ret = wally_psbt_sign(
      psbt_pointer, key.data(), key.size(),
      (has_grind_r) ? EC_FLAG_GRIND_R : 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_sign NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt sign error.");
  }
}